

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutTests::MultiLineUnboundLayoutProducesGlyphRunsForEachLineUTF8(LayoutTests *this)

{
  element_type *peVar1;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  glyph *local_8f8;
  allocator local_879;
  string local_878;
  LocationInfo local_858;
  text_line *local_830;
  text_line *local_828;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_820;
  undefined1 local_808 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_7c0;
  ref_text_line local_7a8;
  undefined1 local_780 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_738;
  ref_text_line local_720;
  undefined1 local_6f8 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_6b0;
  ref_text_line local_698;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_670;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_658;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_640;
  undefined1 auStack_628 [8];
  positioned_glyph reference23 [7];
  undefined1 auStack_5c8 [8];
  positioned_glyph reference22 [4];
  positioned_glyph reference21 [5];
  LocationInfo local_538;
  text_line *local_510;
  text_line *local_508;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_500;
  undefined1 local_4e8 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_4a0;
  ref_text_line local_488;
  undefined1 local_460 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_418;
  ref_text_line local_400;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_3d8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_3c0;
  undefined1 auStack_3a8 [8];
  positioned_glyph reference12 [7];
  undefined1 auStack_348 [8];
  positioned_glyph reference11 [10];
  string local_2c8;
  richtext_t local_2a8;
  allocator local_239;
  string local_238;
  richtext_t local_218;
  undefined1 local_1b0 [8];
  layout l2;
  layout l1;
  const_iterator gr;
  factory_ptr f2;
  undefined1 local_e8 [8];
  factory_ptr f1;
  glyph glyphs [4];
  char_to_index indices [4];
  LayoutTests *this_local;
  
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x20;
  f1.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c666666666666;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4026000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
  glyphs[2].metrics.dx = 0.0;
  glyphs[2].metrics.dy = 0.0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[2].metrics.dy);
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4031000000000000;
  glyphs[3].metrics.dx = 0.0;
  glyphs[3].metrics.dy = 0.0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[3].metrics.dy);
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_e8,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,
             (glyph (*) [4])
             &glyphs[3].outline.
              super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  end._M_current =
       (text_line *)
       &glyphs[3].outline.
        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)&gr,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm2,(glyph (*) [4])end._M_current);
  __gnu_cxx::
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  ::__normal_iterator((__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                       *)&l1._box);
  layout::layout((layout *)&l2._box);
  layout::layout((layout *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,anon_var_dwarf_76ea1,&local_239);
  R(&local_218,&local_238);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l2._box,&local_218,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c8,anon_var_dwarf_76ebb,(allocator *)((long)&reference11[9].d.dy + 3)
            );
  R(&local_2a8,&local_2c8);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&gr);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_1b0,&local_2a8,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference11[9].d.dy + 3));
  reference11[7].d.dx = 1.4013e-45;
  reference11[7].d.dy = 11.0;
  reference11[8].index = 0;
  reference11[8].d.dx = 2.8026e-45;
  reference11[6].index = 0;
  reference11[6].d.dx = 0.0;
  reference11[6].d.dy = 7.1;
  reference11[7].index = 0;
  reference11[4].d.dy = 13.0;
  reference11[5].index = 0;
  reference11[5].d.dx = 1.4013e-45;
  reference11[5].d.dy = 11.0;
  reference11[3].d.dx = 4.2039e-45;
  reference11[3].d.dy = 17.0;
  reference11[4].index = 0;
  reference11[4].d.dx = 2.8026e-45;
  reference11[2].index = 0;
  reference11[2].d.dx = 0.0;
  reference11[2].d.dy = 7.1;
  reference11[3].index = 0;
  reference11[0].d.dy = 13.0;
  reference11[1].index = 0;
  reference11[1].d.dx = 4.2039e-45;
  reference11[1].d.dy = 17.0;
  auStack_348._0_4_ = 1;
  auStack_348._4_4_ = 11.0;
  reference11[0].index = 0;
  reference11[0].d.dx = 2.8026e-45;
  reference11[8].d.dy = 13.0;
  reference11[9].index = 0;
  reference12[4].d.dy = 13.0;
  reference12[5].index = 0;
  reference12[5].d.dx = 4.2039e-45;
  reference12[5].d.dy = 17.0;
  reference12[3].d.dx = 2.8026e-45;
  reference12[3].d.dy = 13.0;
  reference12[4].index = 0;
  reference12[4].d.dx = 2.8026e-45;
  reference12[2].index = 0;
  reference12[2].d.dx = 0.0;
  reference12[2].d.dy = 7.1;
  reference12[3].index = 0;
  reference12[0].d.dy = 13.0;
  reference12[1].index = 0;
  reference12[1].d.dx = 2.8026e-45;
  reference12[1].d.dy = 13.0;
  auStack_3a8._0_4_ = 1;
  auStack_3a8._4_4_ = 11.0;
  reference12[0].index = 0;
  reference12[0].d.dx = 2.8026e-45;
  reference12[6].index = 0;
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_e8);
  font_factory::operator*((font_factory *)local_460);
  ref_glyph_run::ref_glyph_run<10ul>
            ((ref_glyph_run *)(local_460 + 0x10),(shared_ptr<agge::font> *)local_460,0.0,0.0,
             (positioned_glyph (*) [10])auStack_348);
  plural_::operator+(&local_418,(plural_ *)&plural,(ref_glyph_run *)(local_460 + 0x10));
  ref_text_line::ref_text_line(&local_400,0.0,10.0,120.2,&local_418);
  plural_::operator+(&local_3d8,(plural_ *)&plural,&local_400);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_e8);
  font_factory::operator*((font_factory *)local_4e8);
  ref_glyph_run::ref_glyph_run<7ul>
            ((ref_glyph_run *)(local_4e8 + 0x10),(shared_ptr<agge::font> *)local_4e8,0.0,0.0,
             (positioned_glyph (*) [7])auStack_3a8);
  plural_::operator+(&local_4a0,(plural_ *)&plural,(ref_glyph_run *)(local_4e8 + 0x10));
  ref_text_line::ref_text_line(&local_488,0.0,24.0,87.1,&local_4a0);
  tests::operator+(&local_3c0,&local_3d8,&local_488);
  local_508 = (text_line *)layout::begin((layout *)&l2._box);
  local_510 = (text_line *)layout::end((layout *)&l2._box);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_500,(tests *)local_508,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_510,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&reference21[4].d.dy,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,(allocator *)((long)&reference21[4].d.dx + 3));
  ut::LocationInfo::LocationInfo(&local_538,(string *)&reference21[4].d.dy,0x12f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_3c0,&local_500,&local_538);
  ut::LocationInfo::~LocationInfo(&local_538);
  std::__cxx11::string::~string((string *)&reference21[4].d.dy);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference21[4].d.dx + 3));
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_500);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_3c0);
  ref_text_line::~ref_text_line(&local_488);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4a0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_4e8 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_4e8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_3d8);
  ref_text_line::~ref_text_line(&local_400);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_418);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_460 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_460);
  reference21[3].d.dx = 2.8026e-45;
  reference21[3].d.dy = 13.0;
  reference21[4].index = 0;
  reference21[2].index = 0;
  reference21[2].d.dx = 4.2039e-45;
  reference21[2].d.dy = 17.0;
  reference21[3].index = 0;
  reference21[0].d.dy = 17.0;
  reference21[1].index = 0;
  reference21[1].d.dx = 0.0;
  reference21[1].d.dy = 7.1;
  reference22[3].d.dx = 1.4013e-45;
  reference22[3].d.dy = 11.0;
  reference21[0].index = 0;
  reference21[0].d.dx = 4.2039e-45;
  reference22[2].index = 0;
  reference22[2].d.dx = 2.8026e-45;
  reference22[2].d.dy = 13.0;
  reference22[3].index = 0;
  reference22[0].d.dy = 7.1;
  reference22[1].index = 0;
  reference22[1].d.dx = 1.4013e-45;
  reference22[1].d.dy = 11.0;
  auStack_5c8._0_4_ = 1;
  auStack_5c8._4_4_ = 11.0;
  reference22[0].index = 0;
  reference22[0].d.dx = 0.0;
  reference23[4].d.dy = 13.0;
  reference23[5].index = 0;
  reference23[5].d.dx = 4.2039e-45;
  reference23[5].d.dy = 17.0;
  reference23[3].d.dx = 2.8026e-45;
  reference23[3].d.dy = 13.0;
  reference23[4].index = 0;
  reference23[4].d.dx = 2.8026e-45;
  reference23[2].index = 0;
  reference23[2].d.dx = 0.0;
  reference23[2].d.dy = 7.1;
  reference23[3].index = 0;
  reference23[0].d.dy = 13.0;
  reference23[1].index = 0;
  reference23[1].d.dx = 2.8026e-45;
  reference23[1].d.dy = 13.0;
  auStack_628._0_4_ = 1;
  auStack_628._4_4_ = 11.0;
  reference23[0].index = 0;
  reference23[0].d.dx = 2.8026e-45;
  reference23[6].index = 0;
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&gr);
  font_factory::operator*((font_factory *)local_6f8);
  ref_glyph_run::ref_glyph_run<5ul>
            ((ref_glyph_run *)(local_6f8 + 0x10),(shared_ptr<agge::font> *)local_6f8,0.0,0.0,
             (positioned_glyph (*) [5])&reference22[3].d);
  plural_::operator+(&local_6b0,(plural_ *)&plural,(ref_glyph_run *)(local_6f8 + 0x10));
  ref_text_line::ref_text_line(&local_698,0.0,14.0,65.1,&local_6b0);
  plural_::operator+(&local_670,(plural_ *)&plural,&local_698);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&gr);
  font_factory::operator*((font_factory *)local_780);
  ref_glyph_run::ref_glyph_run<4ul>
            ((ref_glyph_run *)(local_780 + 0x10),(shared_ptr<agge::font> *)local_780,0.0,0.0,
             (positioned_glyph (*) [4])auStack_5c8);
  plural_::operator+(&local_738,(plural_ *)&plural,(ref_glyph_run *)(local_780 + 0x10));
  ref_text_line::ref_text_line(&local_720,0.0,32.0,42.1,&local_738);
  tests::operator+(&local_658,&local_670,&local_720);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&gr);
  font_factory::operator*((font_factory *)local_808);
  ref_glyph_run::ref_glyph_run<7ul>
            ((ref_glyph_run *)(local_808 + 0x10),(shared_ptr<agge::font> *)local_808,0.0,0.0,
             (positioned_glyph (*) [7])auStack_628);
  plural_::operator+(&local_7c0,(plural_ *)&plural,(ref_glyph_run *)(local_808 + 0x10));
  ref_text_line::ref_text_line(&local_7a8,0.0,50.0,87.1,&local_7c0);
  tests::operator+(&local_640,&local_658,&local_7a8);
  local_828 = (text_line *)layout::begin((layout *)local_1b0);
  local_830 = (text_line *)layout::end((layout *)local_1b0);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_820,(tests *)local_828,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_830,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_878,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_879);
  ut::LocationInfo::LocationInfo(&local_858,&local_878,0x141);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_640,&local_820,&local_858);
  ut::LocationInfo::~LocationInfo(&local_858);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_820);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_640);
  ref_text_line::~ref_text_line(&local_7a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_7c0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_808 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_808);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_658);
  ref_text_line::~ref_text_line(&local_720);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_738);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_780 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_780);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_670);
  ref_text_line::~ref_text_line(&local_698);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_6b0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_6f8 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_6f8);
  layout::~layout((layout *)local_1b0);
  layout::~layout((layout *)&l2._box);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)&gr);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_e8);
  local_8f8 = (glyph *)&glyphs[3].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_8f8 = local_8f8 + -1;
    mocks::font_accessor::glyph::~glyph(local_8f8);
  } while (local_8f8 !=
           (glyph *)&f1.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( MultiLineUnboundLayoutProducesGlyphRunsForEachLineUTF8 )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { 0x2713, 1 }, { L'B', 2 }, { 0xE0, 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;

				l1.process(R("\xE2\x9C\x93""B\xC3\xA0 \xC3\xA0""B\xE2\x9C\x93 \xE2\x9C\x93""B\n\xE2\x9C\x93""BB BB\xC3\xA0\n"), limit::none(), *f1);
				l2.process(R("\xE2\x9C\x93""\xC3\xA0 \xC3\xA0""B\n\xE2\x9C\x93 \xE2\x9C\x93""B\n\xE2\x9C\x93""BB BB\xC3\xA0"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference11[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference12[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, 
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 120.2f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference11))
					+ ref_text_line(0.0f, 24.0f, 87.1f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference12)),
					mkvector(l1.begin(), l1.end()));


				positioned_glyph reference21[] = {
					{ 1, { 11.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference22[] = {
					{ 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference23[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } },
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 14.0f, 65.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference21))
					+ ref_text_line(0.0f, 32.0f, 42.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference22))
					+ ref_text_line(0.0f, 50.0f, 87.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference23)),
					mkvector(l2.begin(), l2.end()));
			}